

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

string * google::protobuf::internal::CloneSlow(Arena *arena,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *value_local;
  Arena *arena_local;
  
  pbVar1 = Arena::Create<std::__cxx11::string,std::__cxx11::string_const&>(arena,value);
  return pbVar1;
}

Assistant:

std::string* CloneSlow(Arena* arena, const std::string& value) {
  return Arena::Create<std::string>(arena, value);
}